

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_table.c
# Opt level: O2

int llmsset_rehash_bucket(llmsset_t dbs,uint64_t d_idx)

{
  ulong *puVar1;
  uint64_t a;
  uint64_t b;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  a = *(uint64_t *)(dbs->data + d_idx * 0x10);
  b = *(uint64_t *)(dbs->data + d_idx * 0x10 + 8);
  if ((long)(dbs->bitmapc[d_idx >> 6] << (d_idx & 0x3f)) < 0) {
    uVar2 = (*dbs->hash_cb)(a,b,0xcbf29ce484222325);
  }
  else {
    uVar2 = sylvan_tabhash16(a,b,(uint64_t)dbs->bitmapc);
  }
  uVar3 = uVar2 >> 0x11;
  iVar5 = 0;
  uVar4 = uVar2 & 0xffffff0000000000;
  uVar6 = dbs->mask & uVar2;
  uVar7 = uVar6;
  do {
    if (dbs->table[uVar6] == 0) {
      puVar1 = dbs->table + uVar6;
      LOCK();
      bVar8 = *puVar1 == 0;
      if (bVar8) {
        *puVar1 = uVar4 | d_idx;
      }
      UNLOCK();
      if (bVar8) {
        return 1;
      }
    }
    uVar6 = (ulong)((int)uVar6 + 1U & 7) | uVar6 & 0xfffffffffffffff8;
    if (uVar6 == uVar7) {
      iVar5 = iVar5 + 1;
      if (iVar5 == dbs->threshold) {
        LOCK();
        dbs->threshold = dbs->threshold + 1;
        UNLOCK();
      }
      uVar2 = uVar2 + (uVar3 & 0xfffffffffffffff0 | 8);
      uVar6 = dbs->mask & uVar2;
      uVar7 = uVar6;
    }
  } while( true );
}

Assistant:

int
llmsset_rehash_bucket(const llmsset_t dbs, uint64_t d_idx)
{
    const uint64_t * const d_ptr = ((uint64_t*)dbs->data) + 2*d_idx;
    const uint64_t a = d_ptr[0];
    const uint64_t b = d_ptr[1];

    uint64_t hash_rehash = 14695981039346656037LLU;
    const int custom = is_custom_bucket(dbs, d_idx) ? 1 : 0;
    if (custom) hash_rehash = dbs->hash_cb(a, b, hash_rehash);
    else hash_rehash = sylvan_tabhash16(a, b, hash_rehash);
    const uint64_t step = (((hash_rehash >> 20) | 1) << 3);
    const uint64_t new_v = (hash_rehash & MASK_HASH) | d_idx;
    int i=0;

    uint64_t idx, last;
#if LLMSSET_MASK
    last = idx = hash_rehash & dbs->mask;
#else
    last = idx = hash_rehash % dbs->table_size;
#endif

    for (;;) {
        _Atomic(uint64_t)* bucket = &dbs->table[idx];
        uint64_t v = atomic_load_explicit(bucket, memory_order_acquire);
        if (v == 0 && atomic_compare_exchange_strong(bucket, &v, new_v)) return 1;

        // find next idx on probe sequence
        idx = (idx & CL_MASK) | ((idx+1) & CL_MASK_R);
        if (idx == last) {
            if (++i == atomic_load_explicit(&dbs->threshold, memory_order_relaxed)) {
                // failed to find empty spot in probe sequence
                // solution: increase probe sequence length...
                atomic_fetch_add(&dbs->threshold, 1);
            }

            // go to next cache line in probe sequence
            hash_rehash += step;

#if LLMSSET_MASK
            last = idx = hash_rehash & dbs->mask;
#else
            last = idx = hash_rehash % dbs->table_size;
#endif
        }
    }
}